

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.cpp
# Opt level: O2

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::JsonTranslatorOperator::convertToMessage(JsonTranslatorOperator *this,SmallBuffer *value)

{
  long in_RDX;
  SmallBuffer sb;
  defV val;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  val.
  super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  .
  super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  ._M_u._M_first._M_storage = (_Uninitialized<double,_true>)0.0;
  val.
  super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  .
  super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  ._M_index = '\0';
  sb.buffer._M_elems._0_8_ = *(undefined8 *)(in_RDX + 0x40);
  sb.buffer._M_elems._8_8_ = *(undefined8 *)(in_RDX + 0x50);
  sb.buffer._M_elems[0x10] = 0;
  sb.buffer._M_elems[0x11] = 0;
  sb.buffer._M_elems[0x12] = 0;
  sb.buffer._M_elems[0x13] = 0;
  sb.buffer._M_elems[0x14] = 0;
  sb.buffer._M_elems[0x15] = 0;
  sb.buffer._M_elems[0x16] = 0;
  sb.buffer._M_elems[0x17] = 0;
  sb.buffer._M_elems[0x18] = 0;
  sb.buffer._M_elems[0x19] = 0;
  sb.buffer._M_elems[0x1a] = 0;
  sb.buffer._M_elems[0x1b] = 0;
  sb.buffer._M_elems[0x1c] = 0;
  sb.buffer._M_elems[0x1d] = 0;
  sb.buffer._M_elems[0x1e] = 0;
  sb.buffer._M_elems[0x1f] = 0;
  helics::valueExtract((data_view *)&sb,HELICS_ANY,&val);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(sb.buffer._M_elems + 0x18));
  typeConvertDefV(&sb,HELICS_JSON,&val);
  std::make_unique<helics::Message>();
  local_20._M_len = sb.bufferSize;
  local_20._M_str = (char *)sb.heap;
  SmallBuffer::operator=
            ((SmallBuffer *)((this->super_TranslatorOperator)._vptr_TranslatorOperator + 2),
             &local_20);
  SmallBuffer::~SmallBuffer(&sb);
  std::__detail::__variant::
  _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                       *)&val);
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> JsonTranslatorOperator::convertToMessage(const SmallBuffer& value)
{
    defV val;
    valueExtract(value, DataType::HELICS_ANY, val);
    auto sb = typeConvertDefV(DataType::HELICS_JSON, val);
    auto m = std::make_unique<Message>();
    m->data = sb.to_string();
    return m;
}